

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy_io.c
# Opt level: O0

void on_underlying_io_open_complete(void *context,IO_OPEN_RESULT open_result)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  size_t sVar3;
  uchar *source;
  size_t sVar4;
  char *__s;
  LOGGER_LOG *local_178;
  size_t local_140;
  char *local_130;
  size_t local_118;
  LOGGER_LOG l_10;
  LOGGER_LOG l_9;
  LOGGER_LOG l_8;
  size_t malloc_size_1;
  char *connect_request;
  LOGGER_LOG l_7;
  char proxy_basic [30];
  char request_format [43];
  char *auth_string_payload;
  int connect_request_length;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  size_t malloc_size;
  int plain_auth_string_length;
  char *plain_auth_string_bytes;
  STRING_HANDLE encoded_auth_string;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  HTTP_PROXY_IO_INSTANCE *http_proxy_io_instance;
  LOGGER_LOG l;
  IO_OPEN_RESULT open_result_local;
  void *context_local;
  
  if (context == (void *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                ,"on_underlying_io_open_complete",0xfc,1,
                "NULL context in on_underlying_io_open_complete");
    }
  }
  else {
    iVar1 = *context;
    if (iVar1 == 1) {
      if (open_result == IO_OPEN_OK) {
        *(undefined4 *)context = 2;
        if (*(long *)((long)context + 0x68) == 0) {
          plain_auth_string_bytes = (char *)0x0;
        }
        else {
          sVar3 = strlen(*(char **)((long)context + 0x68));
          malloc_size._4_4_ = (int)sVar3 + 1;
          if (*(long *)((long)context + 0x70) != 0) {
            sVar3 = strlen(*(char **)((long)context + 0x70));
            malloc_size._4_4_ = (int)sVar3 + malloc_size._4_4_;
          }
          if ((int)malloc_size._4_4_ < 0) {
            plain_auth_string_bytes = (char *)0x0;
            indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)context);
          }
          else {
            if (malloc_size._4_4_ < 0xfffffffe) {
              local_118 = (long)(int)malloc_size._4_4_ + 1;
            }
            else {
              local_118 = 0xffffffffffffffff;
            }
            if ((local_118 == 0xffffffffffffffff) ||
               (source = (uchar *)malloc(local_118), source == (uchar *)0x0)) {
              plain_auth_string_bytes = (char *)0x0;
              indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)context);
            }
            else {
              if (*(long *)((long)context + 0x70) == 0) {
                local_130 = "";
              }
              else {
                local_130 = *(char **)((long)context + 0x70);
              }
              iVar1 = sprintf((char *)source,"%s:%s",*(undefined8 *)((long)context + 0x68),local_130
                             );
              if (iVar1 < 0) {
                plain_auth_string_bytes = (char *)0x0;
                indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)context);
              }
              else {
                plain_auth_string_bytes =
                     (char *)Azure_Base64_Encode_Bytes(source,(long)(int)malloc_size._4_4_);
                if ((STRING_HANDLE)plain_auth_string_bytes == (STRING_HANDLE)0x0) {
                  p_Var2 = xlogging_get_log_function();
                  if (p_Var2 != (LOGGER_LOG)0x0) {
                    (*p_Var2)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                              ,"on_underlying_io_open_complete",0x15a,1,
                              "Cannot Base64 encode auth string");
                  }
                  indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)context);
                }
              }
              free(source);
            }
          }
        }
        if ((*(long *)((long)context + 0x48) == 0) ||
           ((*(long *)((long)context + 0x68) != 0 && (plain_auth_string_bytes == (char *)0x0)))) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                      ,"on_underlying_io_open_complete",0x16b,1,"Cannot create authorization header"
                     );
          }
        }
        else {
          memcpy(proxy_basic + 0x18,"CONNECT %s:%d HTTP/1.1\r\nHost:%s:%d%s%s\r\n\r\n",0x2b);
          l_7 = (LOGGER_LOG)0x2d79786f72500a0d;
          builtin_strncpy(proxy_basic,"authorization: Basic ",0x16);
          if (*(long *)((long)context + 0x68) == 0) {
            stack0xffffffffffffff78 = "";
          }
          else {
            register0x00000000 = STRING_c_str((STRING_HANDLE)plain_auth_string_bytes);
          }
          sVar3 = strlen(*(char **)((long)context + 0x48));
          sVar4 = strlen(stack0xffffffffffffff78);
          iVar1 = (int)sVar3 * 2 + 0x2a + (int)sVar4;
          auth_string_payload._4_4_ = iVar1 + 10;
          if (*(long *)((long)context + 0x68) != 0) {
            auth_string_payload._4_4_ = iVar1 + 0x27;
          }
          if ((int)auth_string_payload._4_4_ < 0) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                        ,"on_underlying_io_open_complete",0x188,1,
                        "Cannot encode the CONNECT request");
            }
            indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)context);
          }
          else {
            if (auth_string_payload._4_4_ < 0xfffffffe) {
              local_140 = (long)(int)auth_string_payload._4_4_ + 1;
            }
            else {
              local_140 = 0xffffffffffffffff;
            }
            if ((local_140 == 0xffffffffffffffff) ||
               (__s = (char *)malloc(local_140), __s == (char *)0x0)) {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                          ,"on_underlying_io_open_complete",0x193,1,
                          "Cannot allocate memory for CONNECT request");
              }
              indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)context);
            }
            else {
              if (*(long *)((long)context + 0x68) == 0) {
                local_178 = (LOGGER_LOG *)0x124563;
              }
              else {
                local_178 = &l_7;
              }
              iVar1 = sprintf(__s,proxy_basic + 0x18,*(undefined8 *)((long)context + 0x48),
                              (ulong)*(uint *)((long)context + 0x50),
                              *(undefined8 *)((long)context + 0x48),
                              (ulong)*(uint *)((long)context + 0x50),local_178,
                              stack0xffffffffffffff78);
              if (iVar1 < 0) {
                p_Var2 = xlogging_get_log_function();
                if (p_Var2 != (LOGGER_LOG)0x0) {
                  (*p_Var2)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                            ,"on_underlying_io_open_complete",0x1a4,1,
                            "Cannot encode the CONNECT request");
                }
                indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)context);
              }
              else {
                iVar1 = xio_send(*(XIO_HANDLE *)((long)context + 0x78),__s,(long)iVar1,
                                 unchecked_on_send_complete,(void *)0x0);
                if (iVar1 != 0) {
                  p_Var2 = xlogging_get_log_function();
                  if (p_Var2 != (LOGGER_LOG)0x0) {
                    (*p_Var2)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                              ,"on_underlying_io_open_complete",0x1ad,1,
                              "Could not send CONNECT request");
                  }
                  indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)context);
                }
              }
              free(__s);
            }
          }
        }
        if (plain_auth_string_bytes != (char *)0x0) {
          STRING_delete((STRING_HANDLE)plain_auth_string_bytes);
        }
      }
      else if ((open_result == IO_OPEN_ERROR) || (open_result != IO_OPEN_CANCELLED)) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                    ,"on_underlying_io_open_complete",0x119,1,"Underlying IO open failed");
        }
        indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)context);
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                    ,"on_underlying_io_open_complete",0x11f,1,"Underlying IO open failed");
        }
        *(undefined4 *)context = 0;
        xio_close(*(XIO_HANDLE *)((long)context + 0x78),(ON_IO_CLOSE_COMPLETE)0x0,(void *)0x0);
        (**(code **)((long)context + 0x28))(*(undefined8 *)((long)context + 0x30),3);
      }
    }
    else if (iVar1 == 2) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                  ,"on_underlying_io_open_complete",0x10f,1,
                  "Open complete called again by underlying IO.");
      }
      indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)context);
    }
    else if (iVar1 - 3U < 2) {
      (**(code **)((long)context + 0x18))(*(undefined8 *)((long)context + 0x20));
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                  ,"on_underlying_io_open_complete",0x104,1,
                  "on_underlying_io_open_complete called in an unexpected state.");
      }
    }
  }
  return;
}

Assistant:

static void on_underlying_io_open_complete(void* context, IO_OPEN_RESULT open_result)
{
    if (context == NULL)
    {
        /* Codes_SRS_HTTP_PROXY_IO_01_081: [ on_underlying_io_open_complete called with NULL context shall do nothing. ]*/
        LogError("NULL context in on_underlying_io_open_complete");
    }
    else
    {
        HTTP_PROXY_IO_INSTANCE* http_proxy_io_instance = (HTTP_PROXY_IO_INSTANCE*)context;
        switch (http_proxy_io_instance->http_proxy_io_state)
        {
        default:
            LogError("on_underlying_io_open_complete called in an unexpected state.");
            break;

        case HTTP_PROXY_IO_STATE_CLOSING:
        case HTTP_PROXY_IO_STATE_OPEN:
            /* Codes_SRS_HTTP_PROXY_IO_01_077: [ When on_underlying_io_open_complete is called in after OPEN has completed, the on_io_error callback shall be triggered passing the on_io_error_context argument as context. ]*/
            http_proxy_io_instance->on_io_error(http_proxy_io_instance->on_io_error_context);
            break;

        case HTTP_PROXY_IO_STATE_WAITING_FOR_CONNECT_RESPONSE:
            /* Codes_SRS_HTTP_PROXY_IO_01_076: [ When on_underlying_io_open_complete is called while waiting for the CONNECT reply, the on_open_complete callback shall be triggered with IO_OPEN_ERROR, passing also the on_open_complete_context argument as context. ]*/
            LogError("Open complete called again by underlying IO.");
            indicate_open_complete_error_and_close(http_proxy_io_instance);
            break;

        case HTTP_PROXY_IO_STATE_OPENING_UNDERLYING_IO:
            switch (open_result)
            {
            default:
            case IO_OPEN_ERROR:
                /* Codes_SRS_HTTP_PROXY_IO_01_078: [ When on_underlying_io_open_complete is called with IO_OPEN_ERROR, the on_open_complete callback shall be triggered with IO_OPEN_ERROR, passing also the on_open_complete_context argument as context. ]*/
                LogError("Underlying IO open failed");
                indicate_open_complete_error_and_close(http_proxy_io_instance);
                break;

            case IO_OPEN_CANCELLED:
                /* Codes_SRS_HTTP_PROXY_IO_01_079: [ When on_underlying_io_open_complete is called with IO_OPEN_CANCELLED, the on_open_complete callback shall be triggered with IO_OPEN_CANCELLED, passing also the on_open_complete_context argument as context. ]*/
                LogError("Underlying IO open failed");
                http_proxy_io_instance->http_proxy_io_state = HTTP_PROXY_IO_STATE_CLOSED;
                (void)xio_close(http_proxy_io_instance->underlying_io, NULL, NULL);
                http_proxy_io_instance->on_io_open_complete(http_proxy_io_instance->on_io_open_complete_context, IO_OPEN_CANCELLED);
                break;

            case IO_OPEN_OK:
            {
                STRING_HANDLE encoded_auth_string;

                /* Codes_SRS_HTTP_PROXY_IO_01_057: [ When on_underlying_io_open_complete is called, the http_proxy_io shall send the CONNECT request constructed per RFC 2817: ]*/
                http_proxy_io_instance->http_proxy_io_state = HTTP_PROXY_IO_STATE_WAITING_FOR_CONNECT_RESPONSE;

                if (http_proxy_io_instance->username != NULL)
                {
                    char* plain_auth_string_bytes;

                    /* Codes_SRS_HTTP_PROXY_IO_01_060: [ - The value of Proxy-Authorization shall be the constructed according to RFC 2617. ]*/
                    int plain_auth_string_length = (int)(strlen(http_proxy_io_instance->username)+1);
                    if (http_proxy_io_instance->password != NULL)
                    {
                        plain_auth_string_length += (int)strlen(http_proxy_io_instance->password);
                    }

                    if (plain_auth_string_length < 0)
                    {
                        /* Codes_SRS_HTTP_PROXY_IO_01_062: [ If any failure is encountered while constructing the request, the on_open_complete callback shall be triggered with IO_OPEN_ERROR, passing also the on_open_complete_context argument as context. ]*/
                        encoded_auth_string = NULL;
                        indicate_open_complete_error_and_close(http_proxy_io_instance);
                    }
                    else
                    {
                        size_t malloc_size = safe_add_size_t((size_t)plain_auth_string_length, 1);
                        if (malloc_size == SIZE_MAX ||
                            (plain_auth_string_bytes = (char*)malloc(malloc_size)) == NULL)
                        {
                            /* Codes_SRS_HTTP_PROXY_IO_01_062: [ If any failure is encountered while constructing the request, the on_open_complete callback shall be triggered with IO_OPEN_ERROR, passing also the on_open_complete_context argument as context. ]*/
                            encoded_auth_string = NULL;
                            plain_auth_string_bytes = NULL;
                            indicate_open_complete_error_and_close(http_proxy_io_instance);
                        }
                        else
                        {
                            /* Codes_SRS_HTTP_PROXY_IO_01_091: [ To receive authorization, the client sends the userid and password, separated by a single colon (":") character, within a base64 [7] encoded string in the credentials. ]*/
                            /* Codes_SRS_HTTP_PROXY_IO_01_092: [ A client MAY preemptively send the corresponding Authorization header with requests for resources in that space without receipt of another challenge from the server. ]*/
                            /* Codes_SRS_HTTP_PROXY_IO_01_093: [ Userids might be case sensitive. ]*/
                            if (sprintf(plain_auth_string_bytes, "%s:%s", http_proxy_io_instance->username, (http_proxy_io_instance->password == NULL) ? "" : http_proxy_io_instance->password) < 0)
                            {
                                /* Codes_SRS_HTTP_PROXY_IO_01_062: [ If any failure is encountered while constructing the request, the on_open_complete callback shall be triggered with IO_OPEN_ERROR, passing also the on_open_complete_context argument as context. ]*/
                                encoded_auth_string = NULL;
                                indicate_open_complete_error_and_close(http_proxy_io_instance);
                            }
                            else
                            {
                                /* Codes_SRS_HTTP_PROXY_IO_01_061: [ Encoding to Base64 shall be done by calling Azure_Base64_Encode_Bytes. ]*/
                                encoded_auth_string = Azure_Base64_Encode_Bytes((const unsigned char*)plain_auth_string_bytes, plain_auth_string_length);
                                if (encoded_auth_string == NULL)
                                {
                                    /* Codes_SRS_HTTP_PROXY_IO_01_062: [ If any failure is encountered while constructing the request, the on_open_complete callback shall be triggered with IO_OPEN_ERROR, passing also the on_open_complete_context argument as context. ]*/
                                    LogError("Cannot Base64 encode auth string");
                                    indicate_open_complete_error_and_close(http_proxy_io_instance);
                                }
                            }

                            free(plain_auth_string_bytes);
                        }
                    }
                }
                else
                {
                    encoded_auth_string = NULL;
                }

                if (http_proxy_io_instance->hostname == NULL ||
                    (http_proxy_io_instance->username != NULL && encoded_auth_string == NULL))
                {
                    LogError("Cannot create authorization header");
                }
                else
                {
                    int connect_request_length;
                    const char* auth_string_payload;
                    /* Codes_SRS_HTTP_PROXY_IO_01_075: [ The Request-URI portion of the Request-Line is always an 'authority' as defined by URI Generic Syntax [2], which is to say the host name and port number destination of the requested connection separated by a colon: ]*/
                    const char request_format[] = "CONNECT %s:%d HTTP/1.1\r\nHost:%s:%d%s%s\r\n\r\n";
                    const char proxy_basic[] = "\r\nProxy-authorization: Basic ";
                    if (http_proxy_io_instance->username != NULL)
                    {
                        auth_string_payload = STRING_c_str(encoded_auth_string);
                    }
                    else
                    {
                        auth_string_payload = "";
                    }

                    /* Codes_SRS_HTTP_PROXY_IO_01_059: [ - If username and password have been specified in the arguments passed to http_proxy_io_create, then the header Proxy-Authorization shall be added to the request. ]*/

                    connect_request_length = (int)(strlen(request_format)+(strlen(http_proxy_io_instance->hostname)*2)+strlen(auth_string_payload)+10);
                    if (http_proxy_io_instance->username != NULL)
                    {
                        connect_request_length += (int)strlen(proxy_basic);
                    }

                    if (connect_request_length < 0)
                    {
                        /* Codes_SRS_HTTP_PROXY_IO_01_062: [ If any failure is encountered while constructing the request, the on_open_complete callback shall be triggered with IO_OPEN_ERROR, passing also the on_open_complete_context argument as context. ]*/
                        LogError("Cannot encode the CONNECT request");
                        indicate_open_complete_error_and_close(http_proxy_io_instance);
                    }
                    else
                    {
                        char* connect_request;
                        size_t malloc_size = safe_add_size_t((size_t)connect_request_length, 1);
                        if (malloc_size == SIZE_MAX ||
                            (connect_request = (char*)malloc(malloc_size)) == NULL)
                        {
                            /* Codes_SRS_HTTP_PROXY_IO_01_062: [ If any failure is encountered while constructing the request, the on_open_complete callback shall be triggered with IO_OPEN_ERROR, passing also the on_open_complete_context argument as context. ]*/
                            LogError("Cannot allocate memory for CONNECT request");
                            indicate_open_complete_error_and_close(http_proxy_io_instance);
                        }
                        else
                        {
                            /* Codes_SRS_HTTP_PROXY_IO_01_059: [ - If username and password have been specified in the arguments passed to http_proxy_io_create, then the header Proxy-Authorization shall be added to the request. ]*/
                            connect_request_length = sprintf(connect_request, request_format,
                                http_proxy_io_instance->hostname,
                                http_proxy_io_instance->port,
                                http_proxy_io_instance->hostname,
                                http_proxy_io_instance->port,
                                (http_proxy_io_instance->username != NULL) ? proxy_basic : "",
                                auth_string_payload);

                            if (connect_request_length < 0)
                            {
                                /* Codes_SRS_HTTP_PROXY_IO_01_062: [ If any failure is encountered while constructing the request, the on_open_complete callback shall be triggered with IO_OPEN_ERROR, passing also the on_open_complete_context argument as context. ]*/
                                LogError("Cannot encode the CONNECT request");
                                indicate_open_complete_error_and_close(http_proxy_io_instance);
                            }
                            else
                            {
                                /* Codes_SRS_HTTP_PROXY_IO_01_063: [ The request shall be sent by calling xio_send and passing NULL as on_send_complete callback. ]*/
                                if (xio_send(http_proxy_io_instance->underlying_io, connect_request, connect_request_length, unchecked_on_send_complete, NULL) != 0)
                                {
                                    /* Codes_SRS_HTTP_PROXY_IO_01_064: [ If xio_send fails, the on_open_complete callback shall be triggered with IO_OPEN_ERROR, passing also the on_open_complete_context argument as context. ]*/
                                    LogError("Could not send CONNECT request");
                                    indicate_open_complete_error_and_close(http_proxy_io_instance);
                                }
                            }

                            free(connect_request);
                        }
                    }
                }

                if (encoded_auth_string != NULL)
                {
                    STRING_delete(encoded_auth_string);
                }

                break;
            }
            }

            break;
        }
    }
}